

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_004be018;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  (this->iteminputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->itemstringids_ = (StringVector *)0x0;
  this->itemint64ids_ = (Int64Vector *)0x0;
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  itemitemsimilarities_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.ItemSimilarityRecommender)
}